

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

ProducerBase * __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::
recycle_or_create_producer
          (ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *this,
          bool isExplicit,bool *recycled)

{
  bool bVar1;
  __pointer_type producer;
  ProducerBase *pPVar2;
  ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *in_RDX;
  byte in_SIL;
  atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
  *in_RDI;
  bool expected;
  __pointer_type ptr;
  undefined8 in_stack_ffffffffffffffb0;
  memory_order __m;
  ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> **in_stack_ffffffffffffffc0;
  bool local_29;
  
  __m = (memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  producer = std::
             atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
             ::load(in_RDI,__m);
  do {
    if (producer == (__pointer_type)0x0) {
      *(undefined1 *)&(in_RDX->producerListTail)._M_b._M_p = 0;
      if ((in_SIL & 1) == 0) {
        ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::
        create<moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer,moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>*>
                  ((ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> **)in_RDI);
      }
      else {
        ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::
        create<moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer,moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>*>
                  (in_stack_ffffffffffffffc0);
      }
      pPVar2 = add_producer(in_RDX,producer);
      return pPVar2;
    }
    bVar1 = std::atomic<bool>::load((atomic<bool> *)in_RDI,__m);
    if ((bVar1) && ((producer->isExplicit & 1U) == (in_SIL & 1))) {
      local_29 = true;
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        (&(producer->super_ConcurrentQueueProducerTypelessBase).inactive,&local_29,
                         false,memory_order_acquire,memory_order_relaxed);
      if (bVar1) {
        *(undefined1 *)&(in_RDX->producerListTail)._M_b._M_p = 1;
        return producer;
      }
    }
    producer = ProducerBase::next_prod(producer);
  } while( true );
}

Assistant:

ProducerBase* recycle_or_create_producer(bool isExplicit, bool& recycled)
    {
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
        debug::DebugLock lock(implicitProdMutex);
#endif
        // Try to re-use one first
        for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
            if (ptr->inactive.load(std::memory_order_relaxed) && ptr->isExplicit == isExplicit) {
                bool expected = true;
                if (ptr->inactive.compare_exchange_strong(expected, /* desired */ false, std::memory_order_acquire, std::memory_order_relaxed)) {
                    // We caught one! It's been marked as activated, the caller can have it
                    recycled = true;
                    return ptr;
                }
            }
        }
        
        recycled = false;
        return add_producer(isExplicit ? static_cast<ProducerBase*>(create<ExplicitProducer>(this)) : create<ImplicitProducer>(this));
    }